

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O1

void Fraig_ManPrintStats(Fraig_Man_t *p)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  lVar1 = (long)(p->nWordsDyna + p->nWordsRand) * 4 + 0xa0;
  auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar6._0_8_ = lVar1;
  auVar6._12_4_ = 0x45300000;
  printf("Words: Random = %d. Dynamic = %d. Used = %d. Memory = %0.2f MB.\n",
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
         (double)(p->vNodes->nSize + p->vInputs->nSize) * 9.5367431640625e-07,
         (ulong)(uint)p->nWordsRand,(ulong)(uint)p->nWordsDyna,(ulong)(uint)p->iWordPerm);
  printf("Proof = %d. Counter-example = %d. Fail = %d. FailReal = %d. Zero = %d.\n",
         (ulong)(uint)p->nSatProof,(ulong)(uint)p->nSatCounter,(ulong)(uint)p->nSatFails,
         (ulong)(uint)p->nSatFailsReal,(ulong)(uint)p->nSatZeros);
  uVar3 = Fraig_CountNodes(p,0);
  uVar2 = p->vNodes->nSize;
  uVar4 = Fraig_ManCountMuxes(p);
  uVar5 = Fraig_ManCountExors(p);
  printf("Nodes: Final = %d. Total = %d. Mux = %d. (Exor = %d.) ClaVars = %d.\n",(ulong)uVar3,
         (ulong)uVar2,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)p->nVarsClauses);
  if (p->pSat != (Msat_Solver_t *)0x0) {
    Msat_SolverPrintStats(p->pSat);
  }
  printf("%s = ","AIG simulation  ");
  printf("%6.2f sec\n",(double)((float)p->timeSims / 1e+06));
  printf("%s = ","AIG traversal   ");
  printf("%6.2f sec\n",(double)((float)p->timeTrav / 1e+06));
  printf("%s = ","Solver feedback ");
  printf("%6.2f sec\n",(double)((float)p->timeFeed / 1e+06));
  printf("%s = ","SAT solving     ");
  printf("%6.2f sec\n",(double)((float)p->timeSat / 1e+06));
  printf("%s = ","Network update  ");
  printf("%6.2f sec\n",(double)((float)p->timeToNet / 1e+06));
  printf("%s = ","TOTAL RUNTIME   ");
  printf("%6.2f sec\n",(double)((float)p->timeTotal / 1e+06));
  if (0 < p->time1) {
    printf("%s = ","time1");
    printf("%6.2f sec\n",(double)((float)p->time1 / 1e+06));
  }
  if (0 < p->time2) {
    printf("%s = ","time2");
    printf("%6.2f sec\n",(double)((float)p->time2 / 1e+06));
  }
  if (0 < p->time3) {
    printf("%s = ","time3");
    printf("%6.2f sec\n",(double)((float)p->time3 / 1e+06));
  }
  if (0 < p->time4) {
    printf("%s = ","time4");
    printf("%6.2f sec\n",(double)((float)p->time4 / 1e+06));
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fraig_ManPrintStats( Fraig_Man_t * p )
{
    double nMemory;
    nMemory = ((double)(p->vInputs->nSize + p->vNodes->nSize) * 
        (sizeof(Fraig_Node_t) + sizeof(unsigned)*(p->nWordsRand + p->nWordsDyna) /*+ p->nSuppWords*sizeof(unsigned)*/))/(1<<20);
    printf( "Words: Random = %d. Dynamic = %d. Used = %d. Memory = %0.2f MB.\n", 
        p->nWordsRand, p->nWordsDyna, p->iWordPerm, nMemory );
    printf( "Proof = %d. Counter-example = %d. Fail = %d. FailReal = %d. Zero = %d.\n", 
        p->nSatProof, p->nSatCounter, p->nSatFails, p->nSatFailsReal, p->nSatZeros );
    printf( "Nodes: Final = %d. Total = %d. Mux = %d. (Exor = %d.) ClaVars = %d.\n", 
        Fraig_CountNodes(p,0), p->vNodes->nSize, Fraig_ManCountMuxes(p), Fraig_ManCountExors(p), p->nVarsClauses );
    if ( p->pSat ) Msat_SolverPrintStats( p->pSat );
    Fraig_PrintTime( "AIG simulation  ", p->timeSims  );
    Fraig_PrintTime( "AIG traversal   ", p->timeTrav  );
    Fraig_PrintTime( "Solver feedback ", p->timeFeed  );
    Fraig_PrintTime( "SAT solving     ", p->timeSat   );
    Fraig_PrintTime( "Network update  ", p->timeToNet );
    Fraig_PrintTime( "TOTAL RUNTIME   ", p->timeTotal );
    if ( p->time1 > 0 ) { Fraig_PrintTime( "time1", p->time1 ); }
    if ( p->time2 > 0 ) { Fraig_PrintTime( "time2", p->time2 ); }
    if ( p->time3 > 0 ) { Fraig_PrintTime( "time3", p->time3 ); }
    if ( p->time4 > 0 ) { Fraig_PrintTime( "time4", p->time4 ); }
//    ABC_PRT( "Selection ", timeSelect );
//    ABC_PRT( "Assignment", timeAssign );
    fflush( stdout );
}